

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void vkt::api::anon_unknown_1::addCases<vkt::api::(anonymous_namespace)::DeviceMemory>
               (MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *group,
               CaseDescription<vkt::api::(anonymous_namespace)::DeviceMemory> *cases)

{
  char *__s;
  Parameters arg0;
  vkt *this;
  allocator<char> *__a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  undefined1 local_40 [40];
  NamedParameters<vkt::api::(anonymous_namespace)::DeviceMemory> *cur;
  CaseDescription<vkt::api::(anonymous_namespace)::DeviceMemory> *cases_local;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *group_local;
  
  cur = (NamedParameters<vkt::api::(anonymous_namespace)::DeviceMemory> *)cases;
  cases_local = (CaseDescription<vkt::api::(anonymous_namespace)::DeviceMemory> *)group;
  for (local_40._32_8_ = cases->paramsBegin;
      (NamedParameters<vkt::api::(anonymous_namespace)::DeviceMemory> *)local_40._32_8_ !=
      *(NamedParameters<vkt::api::(anonymous_namespace)::DeviceMemory> **)
       &(cur->parameters).memoryTypeIndex; local_40._32_8_ = local_40._32_8_ + 0x18) {
    this = (vkt *)de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::get
                            ((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)cases_local);
    __s = *(char **)local_40._32_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,__s,&local_41);
    __a = &local_79;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",__a);
    arg0._8_8_ = this;
    arg0.size = (VkDeviceSize)__a;
    addFunctionCase<vkt::api::(anonymous_namespace)::DeviceMemory::Parameters>
              (this,(TestCaseGroup *)local_40,&local_78,(string *)cur->name,
               (Function)((Parameters *)(local_40._32_8_ + 8))->size,arg0);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return;
}

Assistant:

void addCases (const MovePtr<tcu::TestCaseGroup>& group, const CaseDescription<Object>& cases)
{
	for (const NamedParameters<Object>* cur = cases.paramsBegin; cur != cases.paramsEnd; ++cur)
		addFunctionCase(group.get(), cur->name, "", cases.function, cur->parameters);
}